

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O3

HRESULT __thiscall
BGParseManager::QueueBackgroundParse
          (BGParseManager *this,LPCUTF8 pszSrc,size_t cbLength,char16 *fullPath,
          DWORD *dwBgParseCookie)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  DWORD DVar4;
  HeapAllocator *alloc;
  BGParseWorkItem *this_00;
  JobProcessor *pJVar5;
  HRESULT HVar6;
  undefined1 local_70 [8];
  TrackAllocData data;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (cbLength == 0) {
    HVar6 = -0x7ff8ffa9;
  }
  else {
    data._32_8_ = fullPath;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_DisableCheck);
    local_70 = (undefined1  [8])&BGParseWorkItem::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_a3b92fc;
    data.filename._0_4_ = 0xb8;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
    this_00 = (BGParseWorkItem *)new<Memory::HeapAllocator>(0xd0,alloc,0x2ff150);
    uVar2 = data._32_8_;
    BGParseWorkItem::BGParseWorkItem(this_00,this,pszSrc,cbLength,(char16 *)data._32_8_);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
    pJVar5 = JsUtil::JobManager::Processor((JobManager *)this);
    local_70 = (undefined1  [8])JsUtil::JobProcessor::GetCriticalSection(pJVar5);
    if (local_70 != (undefined1  [8])0x0) {
      CCLock::Enter((CCLock *)local_70);
    }
    pJVar5 = JsUtil::JobManager::Processor((JobManager *)this);
    (*pJVar5->_vptr_JobProcessor[2])(pJVar5,this_00,0);
    AutoOptionalCriticalSection::~AutoOptionalCriticalSection
              ((AutoOptionalCriticalSection *)local_70);
    *dwBgParseCookie = this_00->cookie;
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BgParsePhase);
    HVar6 = 0;
    if (bVar3) {
      local_70 = (undefined1  [8])Js::Tick::Now();
      uVar1 = this_00->cookie;
      DVar4 = GetCurrentThreadId();
      Js::Tick::ToMilliseconds((Tick *)local_70);
      Output::Print(L"[BgParse: Start -- cookie: %04d on thread 0x%X at %.2f ms -- %s]\n",
                    (ulong)uVar1,(ulong)DVar4,uVar2);
      HVar6 = 0;
    }
  }
  return HVar6;
}

Assistant:

HRESULT BGParseManager::QueueBackgroundParse(LPCUTF8 pszSrc, size_t cbLength, char16 *fullPath, DWORD* dwBgParseCookie)
{
    HRESULT hr = S_OK;
    if (cbLength > 0)
    {
        BGParseWorkItem* workitem;
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
            workitem = HeapNew(BGParseWorkItem, this, (const byte *)pszSrc, cbLength, fullPath);
        }

        // Add the job to the processor
        {
            AutoOptionalCriticalSection autoLock(Processor()->GetCriticalSection());
            Processor()->AddJob(workitem, false /*prioritize*/);
        }

        (*dwBgParseCookie) = workitem->GetCookie();

        if (PHASE_TRACE1(Js::BgParsePhase))
        {
            Js::Tick now = Js::Tick::Now();
            Output::Print(
                _u("[BgParse: Start -- cookie: %04d on thread 0x%X at %.2f ms -- %s]\n"),
                workitem->GetCookie(),
                ::GetCurrentThreadId(),
                now.ToMilliseconds(),
                fullPath
            );
        }
    }
    else
    {
        hr = E_INVALIDARG;
    }

    return hr;
}